

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownGenericExpression
          (FilterCombiner *this,LogicalGet *get,Expression *expr)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  vector<duckdb::ColumnIndex,_true> *this_00;
  ExpressionFilter *this_01;
  const_reference col_idx;
  FilterPushdownResult FVar4;
  size_type __n;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> filter_expr;
  vector<duckdb::ColumnBinding,_true> bindings;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  vector<duckdb::ColumnBinding,_true> local_58;
  FilterCombiner *local_38;
  
  if ((get->function).pushdown_expression == (table_function_pushdown_expression_t)0x0) {
    FVar4 = NO_PUSHDOWN;
  }
  else {
    local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = this;
    ColumnLifetimeAnalyzer::ExtractColumnBindings(expr,&local_58);
    FVar4 = NO_PUSHDOWN;
    if (local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (0x10 < (ulong)((long)local_58.
                               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               .
                               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                              .
                              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        __n = 1;
        FVar4 = NO_PUSHDOWN;
        do {
          pvVar2 = vector<duckdb::ColumnBinding,_true>::operator[](&local_58,__n);
          pvVar3 = vector<duckdb::ColumnBinding,_true>::operator[](&local_58,0);
          if ((pvVar2->table_index != pvVar3->table_index) ||
             (pvVar2->column_index != pvVar3->column_index)) goto LAB_00698c5f;
          __n = __n + 1;
        } while (__n < (ulong)((long)local_58.
                                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     .
                                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_58.
                                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     .
                                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      bVar1 = (*(get->function).pushdown_expression)(local_38->context,get,expr);
      FVar4 = NO_PUSHDOWN;
      if (bVar1) {
        (*(expr->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_70,expr);
        ReplaceWithBoundReference
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_70);
        this_00 = LogicalGet::GetColumnIds(get);
        this_01 = (ExpressionFilter *)operator_new(0x18);
        local_60._M_head_impl = local_70._M_head_impl;
        local_70._M_head_impl = (Expression *)0x0;
        ExpressionFilter::ExpressionFilter
                  (this_01,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_60);
        if (local_60._M_head_impl != (Expression *)0x0) {
          (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        pvVar2 = vector<duckdb::ColumnBinding,_true>::operator[](&local_58,0);
        col_idx = vector<duckdb::ColumnIndex,_true>::operator[](this_00,pvVar2->column_index);
        local_68._M_head_impl = (TableFilter *)this_01;
        TableFilterSet::PushFilter
                  (&get->table_filters,col_idx,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_68);
        if ((ExpressionFilter *)local_68._M_head_impl != (ExpressionFilter *)0x0) {
          (*((TableFilter *)&(local_68._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
        }
        local_68._M_head_impl = (TableFilter *)0x0;
        if (local_70._M_head_impl != (Expression *)0x0) {
          (*((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        FVar4 = PUSHED_DOWN_FULLY;
      }
    }
LAB_00698c5f:
    if (local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return FVar4;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownGenericExpression(LogicalGet &get, Expression &expr) {
	if (!get.function.pushdown_expression) {
		// the scan does not support pushing down generic expressions
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// extract the column bindings from this expression
	vector<ColumnBinding> bindings;
	ColumnLifetimeAnalyzer::ExtractColumnBindings(expr, bindings);
	if (bindings.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// we can only pushdown expressions that refer to exactly one column
	for (idx_t i = 1; i < bindings.size(); i++) {
		if (bindings[i] != bindings[0]) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
	}
	if (!get.function.pushdown_expression(context, get, expr)) {
		// the scan does not support pushing down THIS expression
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// replace the BoundColumnRefExpression with a BoundReference
	auto filter_expr = expr.Copy();
	ReplaceWithBoundReference(filter_expr);

	// push the expression filter
	auto &column_ids = get.GetColumnIds();
	auto expr_filter = make_uniq<ExpressionFilter>(std::move(filter_expr));
	auto &column_index = column_ids[bindings[0].column_index];
	get.table_filters.PushFilter(column_index, std::move(expr_filter));
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}